

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_bitstream.c
# Opt level: O3

UWORD32 ihevcd_bits_num_bits_remaining(bitstrm_t *ps_bitstrm)

{
  uint uVar1;
  UWORD32 UVar2;
  uint uVar3;
  
  uVar3 = (ps_bitstrm->u4_bit_ofst +
          (*(int *)&ps_bitstrm->pu4_buf - *(int *)&ps_bitstrm->pu1_buf_base) * 8) - 0x40;
  uVar1 = (*(int *)&ps_bitstrm->pu1_buf_max - *(int *)&ps_bitstrm->pu1_buf_base) * 8 - 0x40;
  UVar2 = uVar1 - uVar3;
  if (uVar1 < uVar3) {
    UVar2 = 0;
  }
  return UVar2;
}

Assistant:

UWORD32  ihevcd_bits_num_bits_remaining(bitstrm_t *ps_bitstrm)
{
    UWORD32 u4_bits_consumed;
    UWORD32 u4_size_in_bits;

    /* 8 bytes are read in cur_word and nxt_word at the start. Hence */
    /* subtract 8 bytes */
    u4_bits_consumed = (UWORD32)(((UWORD8 *)ps_bitstrm->pu4_buf -
                                  (UWORD8 *)ps_bitstrm->pu1_buf_base - 8) <<
                                 3) + ps_bitstrm->u4_bit_ofst;

    u4_size_in_bits = (UWORD32)(ps_bitstrm->pu1_buf_max -
                    ps_bitstrm->pu1_buf_base) - 8;
    u4_size_in_bits <<= 3;
    if(u4_size_in_bits > u4_bits_consumed)
    {
        return (u4_size_in_bits - u4_bits_consumed);
    }
    else
    {
        return 0;
    }
}